

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Delaunay_psm.h
# Opt level: O0

index_t __thiscall
GEO::Delaunay2d::new_triangle
          (Delaunay2d *this,signed_index_t v1,signed_index_t v2,signed_index_t v3)

{
  index_t iVar1;
  int *piVar2;
  index_t result;
  signed_index_t v3_local;
  signed_index_t v2_local;
  signed_index_t v1_local;
  Delaunay2d *this_local;
  
  iVar1 = new_triangle(this);
  piVar2 = vector<int>::operator[](&this->cell_to_v_store_,iVar1 * 3);
  *piVar2 = v1;
  piVar2 = vector<int>::operator[](&this->cell_to_v_store_,iVar1 * 3 + 1);
  *piVar2 = v2;
  piVar2 = vector<int>::operator[](&this->cell_to_v_store_,iVar1 * 3 + 2);
  *piVar2 = v3;
  return iVar1;
}

Assistant:

index_t new_triangle(
            signed_index_t v1, signed_index_t v2, 
            signed_index_t v3
        ) {
            index_t result = new_triangle();
            cell_to_v_store_[3 * result] = v1;
            cell_to_v_store_[3 * result + 1] = v2;
            cell_to_v_store_[3 * result + 2] = v3;
            return result;
        }